

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

mp_limb_t mpn_neg(mp_ptr rp,mp_srcptr up,mp_size_t n)

{
  long lVar1;
  mp_size_t n_00;
  bool bVar2;
  
  n_00 = n + -1;
  lVar1 = 0;
  while( true ) {
    if (*(long *)((long)up + lVar1) != 0) {
      *(long *)((long)rp + lVar1) = -*(long *)((long)up + lVar1);
      mpn_com((mp_ptr)((long *)((long)rp + lVar1) + 1),(mp_srcptr)((long)up + lVar1 + 8),n_00);
      return 1;
    }
    *(undefined8 *)((long)rp + lVar1) = 0;
    bVar2 = n_00 == 0;
    n_00 = n_00 + -1;
    if (bVar2) break;
    lVar1 = lVar1 + 8;
  }
  return 0;
}

Assistant:

mp_limb_t
mpn_neg (mp_ptr rp, mp_srcptr up, mp_size_t n)
{
  while (*up == 0)
    {
      *rp = 0;
      if (!--n)
	return 0;
      ++up; ++rp;
    }
  *rp = - *up;
  mpn_com (++rp, ++up, --n);
  return 1;
}